

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order.cpp
# Opt level: O0

void __thiscall R_class::ID_exe(R_class *this,memory *MEM,uint *reg)

{
  uint *reg_local;
  memory *MEM_local;
  R_class *this_local;
  
  this->func7 = (this->super_order).code[0] >> 1;
  this->func3 = ((this->super_order).code[2] >> 4) % 8;
  this->rs_id1 = ((this->super_order).code[1] % 0x10) * 2 + ((this->super_order).code[2] >> 7);
  this->rs_id2 = ((this->super_order).code[1] >> 4) + ((this->super_order).code[0] % 2) * 0x10;
  this->rs_data1 = reg[this->rs_id1];
  this->rs_data2 = reg[this->rs_id2];
  this->rd_id = ((this->super_order).code[2] % 0x10) * 2 + ((this->super_order).code[3] >> 7);
  return;
}

Assistant:

void R_class::ID_exe(memory &MEM,unsigned int *reg) {
    func7=code[0]>>1;
    func3=(code[2]>>4)%8;
    rs_id1=((code[1]%16)<<1)+(code[2]>>7);
    rs_id2=(code[1]>>4)+((code[0]%2)<<4);
    rs_data1=reg[rs_id1];
    rs_data2=reg[rs_id2];
    rd_id=((code[2]%16)<<1)+(code[3]>>7);
}